

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O2

size_t duckdb_je_arena_fill_small_fresh
                 (tsdn_t *tsdn,arena_t *arena,szind_t binind,void **ptrs,size_t nfill,_Bool zero)

{
  void **ptrs_00;
  uint uVar1;
  edata_t *peVar2;
  uint uVar3;
  undefined8 slab;
  undefined8 tsdn_00;
  _Bool _Var4;
  arena_t *slab_00;
  undefined1 delay_trigger;
  void **ppvVar5;
  bin_t *bin;
  ulong uVar6;
  ulong uVar7;
  arena_t *arena_00;
  ulong uVar8;
  bool bVar9;
  undefined1 auVar10 [16];
  uint binshard;
  undefined1 local_74 [68];
  
  uVar3 = duckdb_je_manual_arena_base;
  local_74._12_8_ = ZEXT48(duckdb_je_bin_infos[binind].nregs);
  local_74._36_8_ = duckdb_je_bin_infos[binind].reg_size;
  uVar1 = arena->ind;
  bin = (bin_t *)local_74;
  local_74._52_8_ = ptrs;
  local_74._60_8_ = nfill;
  local_74._28_8_ = duckdb_je_arena_bin_choose(tsdn,arena,binind,(uint *)bin);
  local_74._20_8_ = (edata_t *)0x0;
  local_74._4_8_ = 0;
  arena_00 = (arena_t *)0x0;
  local_74._44_8_ = tsdn;
  for (uVar7 = 0; tsdn_00 = local_74._44_8_, uVar8 = local_74._60_8_ - uVar7,
      uVar7 <= (ulong)local_74._60_8_ && uVar8 != 0; uVar7 = uVar7 + uVar6) {
    bin = (bin_t *)(ulong)(uint)local_74._0_4_;
    slab_00 = (arena_t *)
              arena_slab_alloc((tsdn_t *)local_74._44_8_,arena,binind,local_74._0_4_,
                               duckdb_je_bin_infos + binind);
    if (slab_00 == (arena_t *)0x0) {
      arena_00 = (arena_t *)0x0;
      break;
    }
    uVar6 = local_74._12_8_;
    if (uVar8 < (ulong)local_74._12_8_) {
      uVar6 = uVar8;
    }
    ptrs_00 = (void **)(local_74._52_8_ + uVar7 * 8);
    ppvVar5 = ptrs_00;
    arena_slab_reg_alloc_batch((edata_t *)slab_00,duckdb_je_bin_infos + binind,(uint)uVar6,ptrs_00);
    if (zero) {
      switchD_016d8eb1::default(*ptrs_00,0,uVar6 * local_74._36_8_);
    }
    bVar9 = uVar8 < (ulong)local_74._12_8_;
    arena_00 = slab_00;
    if (!bVar9) {
      arena_00 = (arena_t *)0x0;
    }
    bin = (bin_t *)CONCAT71((int7)((ulong)ppvVar5 >> 8),bVar9 || uVar1 < uVar3);
    if (!bVar9 && uVar1 >= uVar3) {
      edata_list_active_append((edata_list_active_t *)(local_74 + 0x14),(edata_t *)slab_00);
      arena_00 = (arena_t *)0x0;
    }
    local_74._4_8_ = local_74._4_8_ + 1;
  }
  slab = local_74._28_8_;
  malloc_mutex_lock((tsdn_t *)tsdn_00,(malloc_mutex_t *)local_74._28_8_);
  if (arena_00 != (arena_t *)0x0) {
    arena_bin_lower_slab((tsdn_t *)arena,arena_00,(edata_t *)slab,bin);
  }
  if (uVar3 <= uVar1) {
    bin = (bin_t *)(slab + 0xf8);
    peVar2 = (((edata_list_active_t *)(slab + 0xf8))->head).qlh_first;
    if (peVar2 != (edata_t *)0x0) {
      if ((edata_t *)local_74._20_8_ == (edata_t *)0x0) goto LAB_01f86bde;
      *(edata_t **)(*(long *)(local_74._20_8_ + 0x30) + 0x28) =
           (peVar2->field_5).ql_link_active.qre_prev;
      peVar2 = *(edata_t **)(local_74._20_8_ + 0x30);
      (((edata_t *)(bin->lock).field_0.witness.name)->field_5).ql_link_active.qre_prev = peVar2;
      *(edata_t **)(local_74._20_8_ + 0x30) = (peVar2->field_5).ql_link_active.qre_next;
      peVar2 = (edata_t *)(bin->lock).field_0.witness.name;
      (((peVar2->field_5).ql_link_active.qre_prev)->field_5).ql_link_active.qre_next = peVar2;
      bin = (bin_t *)(*(long *)(local_74._20_8_ + 0x30) + 0x28);
    }
    (bin->lock).field_0.witness.name = (char *)local_74._20_8_;
  }
LAB_01f86bde:
  delay_trigger = SUB81(bin,0);
  *(uint64_t *)(slab + 0xa0) = *(uint64_t *)(slab + 0xa0) + local_74._4_8_;
  *(size_t *)(slab + 0xb0) = *(size_t *)(slab + 0xb0) + local_74._4_8_;
  ((bin_stats_t *)(slab + 0x70))->nmalloc = ((bin_stats_t *)(slab + 0x70))->nmalloc + uVar7;
  auVar10._8_4_ = (int)uVar7;
  auVar10._0_8_ = uVar7;
  auVar10._12_4_ = (int)(uVar7 >> 0x20);
  *(ulong *)(slab + 0x80) = uVar7 + *(uint64_t *)(slab + 0x80);
  *(size_t *)(slab + 0x88) = auVar10._8_8_ + *(size_t *)(slab + 0x88);
  *(undefined1 *)(slab + 0x40) = 0;
  pthread_mutex_unlock((pthread_mutex_t *)(slab + 0x48));
  if ((tsdn_t *)tsdn_00 != (tsdn_t *)0x0) {
    _Var4 = ticker_geom_ticks((ticker_geom_t *)(tsdn_00 + 0x98),(uint64_t *)(tsdn_00 + 0x70),
                              (uint)('\0' < *(int8_t *)(tsdn_00 + 1)),(_Bool)delay_trigger);
    if (_Var4) {
      duckdb_je_arena_decay((tsdn_t *)tsdn_00,arena,false,false);
    }
  }
  return uVar7;
}

Assistant:

size_t
arena_fill_small_fresh(tsdn_t *tsdn, arena_t *arena, szind_t binind,
    void **ptrs, size_t nfill, bool zero) {
	assert(binind < SC_NBINS);
	const bin_info_t *bin_info = &bin_infos[binind];
	const size_t nregs = bin_info->nregs;
	assert(nregs > 0);
	const size_t usize = bin_info->reg_size;

	const bool manual_arena = !arena_is_auto(arena);
	unsigned binshard;
	bin_t *bin = arena_bin_choose(tsdn, arena, binind, &binshard);

	size_t nslab = 0;
	size_t filled = 0;
	edata_t *slab = NULL;
	edata_list_active_t fulls;
	edata_list_active_init(&fulls);

	while (filled < nfill && (slab = arena_slab_alloc(tsdn, arena, binind,
	    binshard, bin_info)) != NULL) {
		assert((size_t)edata_nfree_get(slab) == nregs);
		++nslab;
		size_t batch = nfill - filled;
		if (batch > nregs) {
			batch = nregs;
		}
		assert(batch > 0);
		arena_slab_reg_alloc_batch(slab, bin_info, (unsigned)batch,
		    &ptrs[filled]);
		assert(edata_addr_get(slab) == ptrs[filled]);
		if (zero) {
			memset(ptrs[filled], 0, batch * usize);
		}
		filled += batch;
		if (batch == nregs) {
			if (manual_arena) {
				edata_list_active_append(&fulls, slab);
			}
			slab = NULL;
		}
	}

	malloc_mutex_lock(tsdn, &bin->lock);
	/*
	 * Only the last slab can be non-empty, and the last slab is non-empty
	 * iff slab != NULL.
	 */
	if (slab != NULL) {
		arena_bin_lower_slab(tsdn, arena, slab, bin);
	}
	if (manual_arena) {
		edata_list_active_concat(&bin->slabs_full, &fulls);
	}
	assert(edata_list_active_empty(&fulls));
	if (config_stats) {
		bin->stats.nslabs += nslab;
		bin->stats.curslabs += nslab;
		bin->stats.nmalloc += filled;
		bin->stats.nrequests += filled;
		bin->stats.curregs += filled;
	}
	malloc_mutex_unlock(tsdn, &bin->lock);

	arena_decay_tick(tsdn, arena);
	return filled;
}